

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O2

void __thiscall QTextFramePrivate::fragmentAdded(QTextFramePrivate *this,QChar type,uint fragment)

{
  if (type.ucs == L'￼') {
    *(uint *)&(this->super_QTextObjectPrivate).field_0x84 = fragment;
  }
  else if (type.ucs != L'﷑') {
    if (type.ucs != L'﷐') {
      return;
    }
    *(uint *)&(this->super_QTextObjectPrivate).field_0x84 = fragment;
    return;
  }
  this->fragment_end = fragment;
  return;
}

Assistant:

void QTextFramePrivate::fragmentAdded(QChar type, uint fragment)
{
    if (type == QTextBeginningOfFrame) {
        Q_ASSERT(!fragment_start);
        fragment_start = fragment;
    } else if (type == QTextEndOfFrame) {
        Q_ASSERT(!fragment_end);
        fragment_end = fragment;
    } else if (type == QChar::ObjectReplacementCharacter) {
        Q_ASSERT(!fragment_start);
        Q_ASSERT(!fragment_end);
        fragment_start = fragment;
        fragment_end = fragment;
    } else {
        Q_ASSERT(false);
    }
}